

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_list.hpp
# Opt level: O2

int iutest::detail::CountIf<iutest::TestInfo*,bool(*)(iutest::TestInfo_const*)>
              (vector<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_> *list,
              _func_bool_TestInfo_ptr *f)

{
  pointer ppTVar1;
  bool bVar2;
  int iVar3;
  pointer ppTVar4;
  
  ppTVar1 = (list->super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  iVar3 = 0;
  for (ppTVar4 = (list->super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>)
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar4 != ppTVar1;
      ppTVar4 = ppTVar4 + 1) {
    bVar2 = (*f)(*ppTVar4);
    iVar3 = iVar3 + (uint)bVar2;
  }
  return iVar3;
}

Assistant:

int CountIf(const ::std::vector<T>& list, Fn f)
{
    int count = 0;
    for(typename ::std::vector<T>::const_iterator it = list.begin(), end = list.end(); it != end; ++it)
    {
        if(f(*it))
        {
            ++count;
        }
    }
    return count;
}